

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::RedundantIAdd::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_00;
  bool bVar1;
  Op OVar2;
  uint uVar3;
  uint uVar4;
  uint32_t id;
  const_reference ppCVar5;
  TypeManager *this_01;
  Operand *local_f8;
  allocator<spvtools::opt::Operand> local_dd;
  uint local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  iterator local_70;
  _func_int **local_68;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_60;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  Type *inst_type;
  Type *operand_type;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvStack_30;
  uint32_t operand;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  pvStack_30 = constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  context_local = (IRContext *)this;
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 != OpIAdd) {
    __assert_fail("inst->opcode() == spv::Op::OpIAdd && \"Wrong opcode. Should be OpIAdd.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x9d3,
                  "auto spvtools::opt::(anonymous namespace)::RedundantIAdd()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  operand_type._4_4_ = std::numeric_limits<unsigned_int>::max();
  inst_type = (Type *)0x0;
  ppCVar5 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::operator[](pvStack_30,0);
  if (*ppCVar5 != (value_type)0x0) {
    ppCVar5 = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[](pvStack_30,0);
    uVar3 = (*(*ppCVar5)->_vptr_Constant[0x17])();
    if ((uVar3 & 1) != 0) {
      operand_type._4_4_ =
           opt::Instruction::GetSingleWordInOperand((Instruction *)constants_local,1);
      ppCVar5 = std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::operator[](pvStack_30,0);
      inst_type = analysis::Constant::type(*ppCVar5);
      goto LAB_009774b9;
    }
  }
  ppCVar5 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::operator[](pvStack_30,1);
  if (*ppCVar5 != (value_type)0x0) {
    ppCVar5 = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[](pvStack_30,1);
    uVar3 = (*(*ppCVar5)->_vptr_Constant[0x17])();
    if ((uVar3 & 1) != 0) {
      operand_type._4_4_ =
           opt::Instruction::GetSingleWordInOperand((Instruction *)constants_local,0);
      ppCVar5 = std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::operator[](pvStack_30,1);
      inst_type = analysis::Constant::type(*ppCVar5);
    }
  }
LAB_009774b9:
  uVar3 = operand_type._4_4_;
  uVar4 = std::numeric_limits<unsigned_int>::max();
  if (uVar3 == uVar4) {
    this_local._7_1_ = false;
  }
  else {
    this_01 = IRContext::get_type_mgr((IRContext *)inst_local);
    id = opt::Instruction::type_id((Instruction *)constants_local);
    local_48._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )analysis::TypeManager::GetType(this_01,id);
    bVar1 = analysis::Type::IsSame
                      ((Type *)local_48._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl,inst_type);
    if (bVar1) {
      opt::Instruction::SetOpcode((Instruction *)constants_local,OpCopyObject);
    }
    else {
      opt::Instruction::SetOpcode((Instruction *)constants_local,OpBitcast);
    }
    this_00 = constants_local;
    local_dc = operand_type._4_4_;
    local_d8 = &local_dc;
    local_d0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
    Operand::Operand(&local_a0,SPV_OPERAND_TYPE_ID,&local_c8);
    local_70 = &local_a0;
    local_68 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator(&local_dd);
    __l._M_len = (size_type)local_68;
    __l._M_array = local_70;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_60,__l,&local_dd);
    opt::Instruction::SetInOperands((Instruction *)this_00,&local_60);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_60)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_dd);
    local_f8 = (Operand *)&local_70;
    do {
      local_f8 = local_f8 + -1;
      Operand::~Operand(local_f8);
    } while (local_f8 != &local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule RedundantIAdd() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpIAdd &&
           "Wrong opcode. Should be OpIAdd.");

    uint32_t operand = std::numeric_limits<uint32_t>::max();
    const analysis::Type* operand_type = nullptr;
    if (constants[0] && constants[0]->IsZero()) {
      operand = inst->GetSingleWordInOperand(1);
      operand_type = constants[0]->type();
    } else if (constants[1] && constants[1]->IsZero()) {
      operand = inst->GetSingleWordInOperand(0);
      operand_type = constants[1]->type();
    }

    if (operand != std::numeric_limits<uint32_t>::max()) {
      const analysis::Type* inst_type =
          context->get_type_mgr()->GetType(inst->type_id());
      if (inst_type->IsSame(operand_type)) {
        inst->SetOpcode(spv::Op::OpCopyObject);
      } else {
        inst->SetOpcode(spv::Op::OpBitcast);
      }
      inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {operand}}});
      return true;
    }
    return false;
  };
}